

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_functs.hpp
# Opt level: O0

void Limonp::loadStr2File(char *filename,openmode mode,string *str)

{
  ostreambuf_iterator<char,_std::char_traits<char>_> __result;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  _Ios_Openmode in_ESI;
  char *in_RDI;
  ostreambuf_iterator<char,_std::char_traits<char>_> itr;
  ofstream out;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  ostreambuf_iterator<char,_std::char_traits<char>_> *in_stack_fffffffffffffd90;
  streambuf_type *local_228;
  undefined8 uStack_220;
  undefined1 local_218 [536];
  
  std::ofstream::ofstream(local_218,in_RDI,in_ESI);
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::ostreambuf_iterator
            (in_stack_fffffffffffffd90,
             (ostream_type *)CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
  __first._M_current = (char *)std::__cxx11::string::begin();
  __last._M_current = (char *)std::__cxx11::string::end();
  __result._8_8_ = uStack_220;
  __result._M_sbuf = local_228;
  std::
  copy<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::ostreambuf_iterator<char,std::char_traits<char>>>
            (__first,__last,__result);
  std::ofstream::close();
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

inline void loadStr2File(const char * const filename, ios_base::openmode mode, const string& str)
    {
        ofstream out(filename, mode);
        ostreambuf_iterator<char> itr (out);
        copy(str.begin(), str.end(), itr);
        out.close();
    }